

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

void walk_ports_recurse0(Port *p,char *name_buffer,size_t buffer_size,Ports *base,void *data,
                        port_walker_t walker,void *runtime,char *old_end,char *write_head,
                        bool expand_bundles,char *read_head,bool ranges)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  do {
    pcVar4 = strchr(read_head + 1,0x23);
    if (pcVar4 == (char *)0x0) {
      sVar5 = strlen(read_head);
    }
    else {
      sVar5 = (long)pcVar4 - (long)read_head;
    }
    if (0 < (long)sVar5) {
      lVar6 = sVar5 + 1;
      do {
        cVar1 = *read_head;
        if (cVar1 == ':') break;
        read_head = read_head + 1;
        *write_head = cVar1;
        write_head = write_head + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    if (pcVar4 == (char *)0x0) {
      if (write_head[-1] != '/') {
        *write_head = '/';
        write_head = write_head + 1;
      }
      *write_head = '\0';
      walk_ports_recurse(p,name_buffer,buffer_size,base,data,walker,runtime,old_end,expand_bundles,
                         (bool)(ranges & 1));
      return;
    }
    uVar2 = atoi(read_head + 1);
    do {
      cVar1 = read_head[1];
      read_head = read_head + 1;
    } while ((int)cVar1 - 0x30U < 10);
    if ((ranges & 1U) == 0) {
      if (uVar2 != 0) {
        uVar8 = 0;
        do {
          iVar3 = snprintf(write_head,0x20,"%d/",uVar8);
          walk_ports_recurse0(p,name_buffer,buffer_size,base,data,walker,runtime,old_end,
                              write_head + iVar3,expand_bundles,read_head + (cVar1 == '/'),false);
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar2 != uVar7);
      }
      return;
    }
    read_head = read_head + (cVar1 == '/');
    iVar3 = snprintf(write_head,0x20,"[0,%d]/",(ulong)(uVar2 - 1));
    write_head = write_head + iVar3;
    ranges = true;
  } while( true );
}

Assistant:

static void walk_ports_recurse0(const Port& p, char* name_buffer,
                                size_t buffer_size, const Ports* base,
                                void* data, port_walker_t walker,
                                void* runtime, char* const old_end, char* write_head,
                                bool expand_bundles, const char* read_head,
                                bool ranges)
{
    ssize_t write_space = buffer_size - (ssize_t)(write_head - name_buffer);
#ifdef NDEBUG
    (void)write_space;
#endif
    const char* hash_ptr = strchr(read_head + 1,'#');
    ssize_t to_copy = hash_ptr ? hash_ptr - read_head : strlen(read_head);

    // Check write space is sufficient
    // The formula is valid for the whole function
    assert(write_space >= to_copy + 32);
    //Append the path, until possible '#'
    //yes, there are subports with ':', e.g. ".../::i"
    while(to_copy-->0 && *read_head != ':')
    {
        *write_head++ = *read_head++;
        --write_space;
    }

    if(hash_ptr)
    {
        //Overwrite the "#.../" by "0/", "1/" ...
        assert(*read_head == '#');
        const unsigned max = atoi(++read_head);
        assert(isdigit(*read_head));
        for(;isdigit(*read_head); ++read_head) {}

        if(*read_head == '/') { ++read_head; }
        if(ranges)
        {
            assert(write_space > 32);
            int written = snprintf(write_head,32,"[0,%d]/", max-1);
            //Recurse
            walk_ports_recurse0(p, name_buffer, buffer_size, base, data, walker,
                                runtime, old_end, write_head + written,
                                expand_bundles, read_head, ranges);
        }
        else for(unsigned i=0; i<max; ++i)
        {
            assert(write_space > 32);
            int written = snprintf(write_head,32,"%d/",i);
            //Recurse
            walk_ports_recurse0(p, name_buffer, buffer_size, base, data, walker,
                                runtime, old_end, write_head + written,
                                expand_bundles, read_head, ranges);
        }
    }
    else
    {
        //Ensure last to trail with "/" before recursion
        if(write_head[-1] != '/')
            *write_head++ = '/';
        *write_head = 0;
        //Recurse
        walk_ports_recurse(p, name_buffer, buffer_size,
                           *base, data, walker, runtime, old_end,
                           expand_bundles, ranges);
    }
}